

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O3

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_4U>::
execute<asio::detail::executor_function>
          (basic_executor_type<std::allocator<void>,_4U> *this,executor_function *f)

{
  impl_base *piVar1;
  long *plVar2;
  long *plVar3;
  undefined8 uVar4;
  long *in_FS_OFFSET;
  ptr local_28;
  
  if ((this->bits_ & 1) == 0) {
    plVar3 = *(long **)(*in_FS_OFFSET + -0x10);
    if (plVar3 != (long *)0x0) {
      plVar2 = (long *)(*in_FS_OFFSET + -0x10);
      do {
        if ((impl_type *)*plVar3 == this->io_context_->impl_) {
          if (plVar3[1] != 0) {
            piVar1 = f->impl_;
            f->impl_ = (impl_base *)0x0;
            if (piVar1 == (impl_base *)0x0) {
              return;
            }
            (*piVar1->complete_)(piVar1,true);
            return;
          }
          break;
        }
        plVar3 = (long *)plVar3[2];
      } while (plVar3 != (long *)0x0);
      goto LAB_001125e8;
    }
  }
  else {
    plVar2 = (long *)(*in_FS_OFFSET + -0x10);
LAB_001125e8:
    if (*plVar2 != 0) {
      uVar4 = *(undefined8 *)(*plVar2 + 8);
      goto LAB_00112608;
    }
  }
  uVar4 = 0;
LAB_00112608:
  local_28.a = (allocator<void> *)&this->field_0x8;
  local_28.v = detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                         (uVar4,0x28);
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_28.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_28.v)->super_scheduler_operation).func_ =
       detail::
       executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::do_complete;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_28.v)->super_scheduler_operation).task_result_ = 0;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_28.v)->handler_).impl_ = f->impl_;
  f->impl_ = (impl_base *)0x0;
  local_28.p = (executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)local_28.v;
  detail::scheduler::post_immediate_completion
            (this->io_context_->impl_,(operation *)local_28.v,SUB41((this->bits_ & 2) >> 1,0));
  local_28.v = (void *)0x0;
  local_28.p = (executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)0x0;
  detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::reset(&local_28);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits_ & blocking_never) == 0 && io_context_->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      io_context_->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = { detail::addressof(allocator_),
      op::ptr::allocate(allocator_), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f), allocator_);

  ASIO_HANDLER_CREATION((*io_context_, *p.p,
        "io_context", io_context_, 0, "execute"));

  io_context_->impl_.post_immediate_completion(p.p,
      (bits_ & relationship_continuation) != 0);
  p.v = p.p = 0;
}